

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytes.cc
# Opt level: O2

t_object * xemmai::t_bytes::f_instantiate(size_t a_size)

{
  t_object *ptVar1;
  long in_FS_OFFSET;
  
  ptVar1 = t_type_of<xemmai::t_bytes>::f__construct
                     (*(t_type **)(*(long *)(in_FS_OFFSET + -0x78) + 0x1e8),a_size);
  return ptVar1;
}

Assistant:

t_object* t_bytes::f_instantiate(size_t a_size)
{
	return t_type_of<t_bytes>::f__construct(f_global()->f_type<t_bytes>(), a_size);
}